

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogPipe.cpp
# Opt level: O0

void __thiscall liblogger::LogPipe::LogPipe(LogPipe *this,string *command)

{
  char *__command;
  ILogger message;
  ostream *poVar1;
  undefined8 uVar2;
  string *in_RSI;
  LogException *in_RDI;
  stringstream ss;
  stringstream local_1a8 [16];
  ostream local_198 [392];
  string *local_10;
  
  local_10 = in_RSI;
  ILogger::ILogger((ILogger *)in_RDI);
  *(undefined ***)in_RDI = &PTR__LogPipe_001cc6b0;
  std::__cxx11::string::string((string *)&in_RDI->m_message,local_10);
  __command = (char *)std::__cxx11::string::c_str();
  message._vptr_ILogger = (_func_int **)popen(__command,"w");
  *(_func_int ***)(in_RDI + 1) = message._vptr_ILogger;
  if (*(_func_int ***)(in_RDI + 1) == (_func_int **)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(local_198,"failed to open pipe \'");
    poVar1 = std::operator<<(poVar1,(string *)&in_RDI->m_message);
    std::operator<<(poVar1,"\'");
    uVar2 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_RDI,(string *)message._vptr_ILogger);
    __cxa_throw(uVar2,&LogException::typeinfo,LogException::~LogException);
  }
  return;
}

Assistant:

LogPipe::LogPipe(const std::string &command) :
	m_command(command)
{
	m_fp = popen(m_command.c_str(), "w");
	if (!m_fp)
	{
		std::stringstream ss;
		ss << "failed to open pipe '" << m_command << "'";
		throw(LogException(ss.str()));
	}
}